

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scantoken.cpp
# Opt level: O3

void __thiscall YAML::Scanner::ScanFlowEntry(Scanner *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  undefined8 uVar3;
  bool bVar4;
  _Elt_pointer pFVar5;
  _Elt_pointer pFVar6;
  _Elt_pointer pFVar7;
  Token local_78;
  
  pFVar5 = (this->m_flows).c.
           super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pFVar5 != (this->m_flows).c.
                super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    pFVar6 = (this->m_flows).c.
             super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first;
    pFVar7 = pFVar5;
    if (pFVar5 == pFVar6) {
      pFVar7 = (this->m_flows).c.
               super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
    }
    if (pFVar7[-1] == FLOW_MAP) {
      bVar4 = VerifySimpleKey(this);
      if (bVar4) {
        local_78.mark.pos = (this->INPUT).m_mark.pos;
        local_78.mark.line = (this->INPUT).m_mark.line;
        local_78.mark.column = (this->INPUT).m_mark.column;
        paVar1 = &local_78.value.field_2;
        local_78.status = VALID;
        local_78.type = VALUE;
        local_78.value._M_string_length = 0;
        local_78.value.field_2._M_local_buf[0] = '\0';
        local_78.params.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_78.params.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
        local_78.params.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
        local_78.params.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        local_78._76_8_ = 0;
        local_78.value._M_dataplus._M_p = (pointer)paVar1;
        std::deque<YAML::Token,_std::allocator<YAML::Token>_>::emplace_back<YAML::Token>
                  (&(this->m_tokens).c,&local_78);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_78.params);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78.value._M_dataplus._M_p != paVar1) {
          operator_delete(local_78.value._M_dataplus._M_p);
        }
        goto LAB_00716754;
      }
      pFVar5 = (this->m_flows).c.
               super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      pFVar6 = (this->m_flows).c.
               super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_first;
    }
    if (pFVar5 == pFVar6) {
      pFVar5 = (this->m_flows).c.
               super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
    }
    if (pFVar5[-1] == FLOW_SEQ) {
      InvalidateSimpleKey(this);
    }
  }
LAB_00716754:
  this->m_simpleKeyAllowed = true;
  this->m_canBeJSONFlow = false;
  uVar3._0_4_ = (this->INPUT).m_mark.pos;
  uVar3._4_4_ = (this->INPUT).m_mark.line;
  iVar2 = (this->INPUT).m_mark.column;
  YAML::Stream::eat(&this->INPUT,1);
  paVar1 = &local_78.value.field_2;
  local_78.status = VALID;
  local_78.type = FLOW_ENTRY;
  local_78.value._M_string_length = 0;
  local_78.value.field_2._M_local_buf[0] = '\0';
  local_78.params.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.params.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_78.params.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  local_78.params.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_78._76_8_ = 0;
  local_78.mark._0_8_ = uVar3;
  local_78.mark.column = iVar2;
  local_78.value._M_dataplus._M_p = (pointer)paVar1;
  std::deque<YAML::Token,_std::allocator<YAML::Token>_>::emplace_back<YAML::Token>
            (&(this->m_tokens).c,&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78.params);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.value._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.value._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Scanner::ScanFlowEntry() {
  // we might have a solo entry in the flow context
  if (InFlowContext()) {
    if (m_flows.top() == FLOW_MAP && VerifySimpleKey())
      m_tokens.push(Token(Token::VALUE, INPUT.mark()));
    else if (m_flows.top() == FLOW_SEQ)
      InvalidateSimpleKey();
  }

  m_simpleKeyAllowed = true;
  m_canBeJSONFlow = false;

  // eat
  Mark mark = INPUT.mark();
  INPUT.eat(1);
  m_tokens.push(Token(Token::FLOW_ENTRY, mark));
}